

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O2

void __thiscall
amrex::STLtools::updateIntercept
          (STLtools *this,Array<Array4<Real>,_3> *inter_arr,
          Array<Array4<const_EB2::Type_t>,_3> *type_arr,Array4<const_double> *lst,Geometry *geom)

{
  Real RVar1;
  Real RVar2;
  Real RVar3;
  Real RVar4;
  Real RVar5;
  Real RVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  int idim;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  Real RVar33;
  Real RVar34;
  Box bx;
  long local_130;
  long local_128;
  long local_108;
  long local_100;
  Box local_4c;
  
  RVar1 = (geom->super_CoordSys).dx[0];
  RVar2 = (geom->super_CoordSys).dx[1];
  RVar3 = (geom->super_CoordSys).dx[2];
  RVar4 = (geom->prob_domain).xlo[0];
  RVar5 = (geom->prob_domain).xlo[1];
  RVar6 = (geom->prob_domain).xlo[2];
  lVar29 = 0;
  do {
    if (lVar29 == 3) {
      return;
    }
    Box::Box<double>(&local_4c,inter_arr->_M_elems + lVar29);
    lVar10 = type_arr->_M_elems[lVar29].jstride;
    iVar8 = type_arr->_M_elems[lVar29].begin.y;
    lVar21 = (long)(lst->begin).x;
    lVar22 = (long)(lst->begin).z;
    lVar12 = (long)local_4c.smallend.vect[2];
    lVar15 = (long)local_4c.smallend.vect[0];
    lVar19 = lst->kstride * 8;
    local_100 = (lVar12 - lVar22) * lVar19 + lVar15 * 8 + lVar21 * -8 + (long)lst->p;
    local_108 = ((lVar12 - lVar22) + 1) * lVar19 + lVar15 * 8 + lVar21 * -8 + (long)lst->p;
    lVar27 = inter_arr->_M_elems[lVar29].kstride * 8;
    lVar21 = inter_arr->_M_elems[lVar29].jstride;
    lVar30 = type_arr->_M_elems[lVar29].kstride * 4;
    iVar9 = inter_arr->_M_elems[lVar29].begin.y;
    local_128 = (lVar12 - inter_arr->_M_elems[lVar29].begin.z) * lVar27 + lVar15 * 8 +
                (long)inter_arr->_M_elems[lVar29].begin.x * -8 + (long)inter_arr->_M_elems[lVar29].p
    ;
    local_130 = (lVar12 - type_arr->_M_elems[lVar29].begin.z) * lVar30 + lVar15 * 4 +
                (long)type_arr->_M_elems[lVar29].begin.x * -4 + (long)type_arr->_M_elems[lVar29].p;
    lVar22 = lst->jstride * 8;
    lVar13 = (long)(lst->begin).y;
    while (lVar12 <= local_4c.bigend.vect[2]) {
      lVar28 = (long)local_4c.smallend.vect[1];
      while (lVar28 <= local_4c.bigend.vect[1]) {
        if (local_4c.bigend.vect[0] < local_4c.smallend.vect[0]) {
          lVar28 = lVar28 + 1;
        }
        else {
          lVar18 = lVar28 - iVar8;
          lVar16 = lVar28 + 1;
          iVar11 = (int)lVar28;
          iVar26 = iVar11 + 1;
          lVar31 = (lVar28 - lVar13) * lVar22;
          lVar32 = lVar31 + local_100;
          lVar20 = (lVar28 - iVar9) * lVar21 * 8 + local_128;
          lVar14 = 0;
          lVar17 = lVar15;
          do {
            if (*(int *)(lVar18 * lVar10 * 4 + local_130 + lVar14 * 4) == 2) {
              dVar7 = *(double *)(lVar32 + lVar14 * 8);
              bVar24 = !NAN(*(double *)(lVar20 + lVar14 * 8));
              bVar23 = (dVar7 <= 0.0 || bVar24) && dVar7 != 0.0;
              if ((int)lVar29 == 1) {
                RVar33 = RVar5;
                iVar25 = iVar11;
                RVar34 = RVar2;
                if (bVar23) {
                  dVar7 = *(double *)((lVar16 - lVar13) * lVar22 + local_100 + lVar14 * 8);
                  iVar25 = iVar26;
                  if ((dVar7 != 0.0) || (NAN(dVar7))) {
                    bVar24 = dVar7 <= 0.0 || bVar24;
                    goto LAB_006de4fc;
                  }
                }
              }
              else if ((int)lVar29 == 0) {
                RVar33 = RVar4;
                RVar34 = RVar1;
                if ((dVar7 <= 0.0 || bVar24) && dVar7 != 0.0) {
                  iVar25 = (int)lVar17 + 1;
                  dVar7 = *(double *)(lVar32 + 8 + lVar14 * 8);
                  if ((dVar7 != 0.0) || (NAN(dVar7))) {
                    bVar24 = dVar7 <= 0.0 || bVar24;
LAB_006de4fc:
                    if (bVar24) goto LAB_006de527;
                  }
                }
                else {
                  iVar25 = local_4c.smallend.vect[0] + (int)lVar14;
                }
              }
              else {
                RVar33 = RVar6;
                iVar25 = (int)lVar12;
                RVar34 = RVar3;
                if (bVar23) {
                  dVar7 = *(double *)(local_108 + lVar31 + lVar14 * 8);
                  iVar25 = (int)(lVar12 + 1);
                  if ((dVar7 != 0.0) || (NAN(dVar7))) {
                    bVar24 = dVar7 <= 0.0 || bVar24;
                    goto LAB_006de4fc;
                  }
                }
              }
              *(double *)(lVar20 + lVar14 * 8) = (double)iVar25 * RVar34 + RVar33;
            }
LAB_006de527:
            lVar17 = lVar17 + 1;
            lVar14 = lVar14 + 1;
            lVar28 = lVar16;
          } while (~local_4c.bigend.vect[0] + local_4c.smallend.vect[0] + (int)lVar14 != 0);
        }
      }
      local_100 = local_100 + lVar19;
      local_108 = local_108 + lVar19;
      local_128 = local_128 + lVar27;
      local_130 = local_130 + lVar30;
      lVar12 = lVar12 + 1;
    }
    lVar29 = lVar29 + 1;
  } while( true );
}

Assistant:

void
STLtools::updateIntercept (Array<Array4<Real>,AMREX_SPACEDIM> const& inter_arr,
                           Array<Array4<EB2::Type_t const>,AMREX_SPACEDIM> const& type_arr,
                           Array4<Real const> const& lst, Geometry const& geom) const
{
    auto const& dx = geom.CellSizeArray();
    auto const& problo = geom.ProbLoArray();
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        Array4<Real> const& inter = inter_arr[idim];
        Array4<EB2::Type_t const> const& type = type_arr[idim];
        const Box bx{inter};
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k)
        {
            if (type(i,j,k) == EB2::Type::irregular) {
                bool is_nan = amrex::isnan(inter(i,j,k));
                if (idim == 0) {
                    if (lst(i,j,k) == Real(0.0) ||
                        (lst(i,j,k) > Real(0.0) && is_nan))
                    {
                        // interp might still be quiet_nan because lst that
                        // was set to zero has been changed by FillBoundary
                        // at periodic bounadries.
                        inter(i,j,k) = problo[0] + i*dx[0];
                    }
                    else if (lst(i+1,j,k) == Real(0.0) ||
                             (lst(i+1,j,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[0] + (i+1)*dx[0];
                    }
                } else if (idim == 1) {
                    if (lst(i,j,k) == Real(0.0) ||
                        (lst(i,j,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[1] + j*dx[1];
                    }
                    else if (lst(i,j+1,k) == Real(0.0) ||
                             (lst(i,j+1,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[1] + (j+1)*dx[1];
                    }
                } else {
                    if (lst(i,j,k) == Real(0.0) ||
                        (lst(i,j,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[2] + k*dx[2];
                        }
                    else if (lst(i,j,k+1) == Real(0.0) ||
                             (lst(i,j,k+1) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[2] + (k+1)*dx[2];
                    }
                }
            }
        });
    }
}